

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

void AddCoins(CCoinsViewCache *cache,CTransaction *tx,int nHeight,bool check_for_overwrite)

{
  byte bVar1;
  COutPoint *outpoint;
  Coin *pCVar2;
  byte in_CL;
  undefined4 in_EDX;
  CTxOut *in_RDI;
  long in_FS_OFFSET;
  bool overwrite;
  size_t i;
  Txid *txid;
  bool fCoinbase;
  undefined4 in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  CTxOut *in_stack_ffffffffffffff10;
  CTransaction *in_stack_ffffffffffffff18;
  byte local_c9;
  Coin *pCVar3;
  Coin *coin;
  undefined2 in_stack_ffffffffffffff68;
  byte bVar4;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  local_c9 = CTransaction::IsCoinBase(in_stack_ffffffffffffff18);
  outpoint = (COutPoint *)
             CTransaction::GetHash
                       ((CTransaction *)
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  pCVar3 = (Coin *)0x0;
  while (coin = pCVar3,
        pCVar2 = (Coin *)std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                                   ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
        pCVar3 < pCVar2) {
    bVar4 = local_c9;
    if ((bVar1 & 1) != 0) {
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffff18,(Txid *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c);
      bVar4 = local_c9;
      local_c9 = (**(code **)(*(long *)(((uint256 *)&in_RDI->nValue)->super_base_blob<256U>).m_data.
                                       _M_elems + 8))(in_RDI,&stack0xffffffffffffffd4);
    }
    local_c9 = local_c9 & 1;
    in_stack_ffffffffffffff18 = (CTransaction *)&stack0xffffffffffffffb0;
    in_stack_ffffffffffffff10 = in_RDI;
    COutPoint::COutPoint
              ((COutPoint *)in_stack_ffffffffffffff18,(Txid *)in_RDI,in_stack_ffffffffffffff0c);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff18,
               (size_type)in_stack_ffffffffffffff10);
    Coin::Coin((Coin *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
               ,SUB41((uint)in_stack_ffffffffffffff08 >> 0x18,0));
    CCoinsViewCache::AddCoin
              ((CCoinsViewCache *)
               CONCAT44(in_EDX,CONCAT13(bVar1,CONCAT12(bVar4,in_stack_ffffffffffffff68))),outpoint,
               coin,(bool)local_c9);
    Coin::~Coin((Coin *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_c9 = bVar4;
    pCVar3 = (Coin *)((long)&(coin->out).nValue + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddCoins(CCoinsViewCache& cache, const CTransaction &tx, int nHeight, bool check_for_overwrite) {
    bool fCoinbase = tx.IsCoinBase();
    const Txid& txid = tx.GetHash();
    for (size_t i = 0; i < tx.vout.size(); ++i) {
        bool overwrite = check_for_overwrite ? cache.HaveCoin(COutPoint(txid, i)) : fCoinbase;
        // Coinbase transactions can always be overwritten, in order to correctly
        // deal with the pre-BIP30 occurrences of duplicate coinbase transactions.
        cache.AddCoin(COutPoint(txid, i), Coin(tx.vout[i], nHeight, fCoinbase), overwrite);
    }
}